

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Catch::Detail::splitReporterSpec_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Detail *this,StringRef reporterSpec)

{
  char cVar1;
  ulong uVar2;
  size_type shortened_size;
  ulong uVar3;
  ulong uVar4;
  ulong index;
  StringRef reporterSpec_local;
  StringRef local_60;
  string local_50;
  
  reporterSpec_local.m_size = (size_type)reporterSpec.m_start;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = 0;
  reporterSpec_local.m_start = (char *)this;
  do {
    uVar2 = uVar3;
    uVar3 = reporterSpec_local.m_size;
    index = uVar2;
    if (reporterSpec_local.m_size <= uVar2) break;
    do {
      while ((index < uVar3 &&
             (cVar1 = StringRef::operator[](&reporterSpec_local,index),
             uVar3 = reporterSpec_local.m_size, cVar1 != ':'))) {
        index = index + 1;
      }
      uVar4 = index + 1;
      if ((uVar4 < uVar3) &&
         (cVar1 = StringRef::operator[](&reporterSpec_local,uVar4),
         uVar3 = reporterSpec_local.m_size, cVar1 == ':')) goto LAB_00155136;
      index = uVar4;
    } while (uVar4 < uVar3);
    index = 0xffffffffffffffff;
LAB_00155136:
    uVar4 = uVar3 - uVar2;
    if (uVar3 < uVar2 || uVar4 == 0) {
      local_60.m_start = "";
      local_60.m_size = 0;
    }
    else {
      local_60.m_start = reporterSpec_local.m_start + uVar2;
      local_60.m_size = index - uVar2;
      if (uVar4 < index - uVar2) {
        local_60.m_size = uVar4;
      }
    }
    StringRef::operator_cast_to_string(&local_50,&local_60);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    uVar3 = index + 2;
  } while (index != 0xffffffffffffffff);
  if (uVar2 == reporterSpec_local.m_size) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> splitReporterSpec( StringRef reporterSpec ) {
            static constexpr auto separator = "::";
            static constexpr size_t separatorSize = 2;

            size_t separatorPos = 0;
            auto findNextSeparator = [&reporterSpec]( size_t startPos ) {
                static_assert(
                    separatorSize == 2,
                    "The code below currently assumes 2 char separator" );

                auto currentPos = startPos;
                do {
                    while ( currentPos < reporterSpec.size() &&
                            reporterSpec[currentPos] != separator[0] ) {
                        ++currentPos;
                    }
                    if ( currentPos + 1 < reporterSpec.size() &&
                         reporterSpec[currentPos + 1] == separator[1] ) {
                        return currentPos;
                    }
                    ++currentPos;
                } while ( currentPos < reporterSpec.size() );

                return static_cast<size_t>( -1 );
            };

            std::vector<std::string> parts;

            while ( separatorPos < reporterSpec.size() ) {
                const auto nextSeparator = findNextSeparator( separatorPos );
                parts.push_back( static_cast<std::string>( reporterSpec.substr(
                    separatorPos, nextSeparator - separatorPos ) ) );

                if ( nextSeparator == static_cast<size_t>( -1 ) ) {
                    break;
                }
                separatorPos = nextSeparator + separatorSize;
            }

            // Handle a separator at the end.
            // This is not a valid spec, but we want to do validation in a
            // centralized place
            if ( separatorPos == reporterSpec.size() ) {
                parts.emplace_back();
            }

            return parts;
        }